

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

FT_Bool SkipCode(TT_ExecContext exc)

{
  TT_ExecContext exc_local;
  
  exc->IP = (long)exc->length + exc->IP;
  if (exc->IP < exc->codeSize) {
    exc->opcode = exc->code[exc->IP];
    exc->length = (int)opcode_length[exc->opcode];
    if (exc->length < 0) {
      if (exc->codeSize <= exc->IP + 1) goto LAB_001b1f9a;
      exc->length = 2 - exc->length * (uint)exc->code[exc->IP + 1];
    }
    if (exc->IP + (long)exc->length <= exc->codeSize) {
      return '\0';
    }
  }
LAB_001b1f9a:
  exc->error = 0x83;
  return '\x01';
}

Assistant:

static FT_Bool
  SkipCode( TT_ExecContext  exc )
  {
    exc->IP += exc->length;

    if ( exc->IP < exc->codeSize )
    {
      exc->opcode = exc->code[exc->IP];

      exc->length = opcode_length[exc->opcode];
      if ( exc->length < 0 )
      {
        if ( exc->IP + 1 >= exc->codeSize )
          goto Fail_Overflow;
        exc->length = 2 - exc->length * exc->code[exc->IP + 1];
      }

      if ( exc->IP + exc->length <= exc->codeSize )
        return SUCCESS;
    }

  Fail_Overflow:
    exc->error = FT_THROW( Code_Overflow );
    return FAILURE;
  }